

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.c
# Opt level: O0

int lgx_co_schedule(lgx_vm_t *vm)

{
  int iVar1;
  lgx_co_t *co;
  lgx_vm_t *vm_local;
  
  if (vm->co_running != (lgx_co_t *)0x0) {
    __assert_fail("vm->co_running == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/interpreter/coroutine.c"
                  ,0xa0,"int lgx_co_schedule(lgx_vm_t *)");
  }
  iVar1 = lgx_co_has_ready_task(vm);
  if (iVar1 != 0) {
    iVar1 = lgx_co_run(vm,(lgx_co_t *)(vm->co_ready).next);
    return iVar1;
  }
  __assert_fail("lgx_co_has_ready_task(vm)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/interpreter/coroutine.c"
                ,0xa1,"int lgx_co_schedule(lgx_vm_t *)");
}

Assistant:

int lgx_co_schedule(lgx_vm_t *vm) {
    assert(vm->co_running == NULL);
    assert(lgx_co_has_ready_task(vm));

    lgx_co_t *co = lgx_list_first_entry(&vm->co_ready, lgx_co_t, head);

    return lgx_co_run(vm, co);
}